

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvector_manyvector.c
# Opt level: O3

void N_VSpace_ManyVector(N_Vector v,sunindextype *lrw,sunindextype *liw)

{
  long lVar1;
  long *plVar2;
  long lVar3;
  long lVar4;
  sunindextype liw1;
  sunindextype lrw1;
  long local_40;
  long local_38;
  
  *lrw = 0;
  *liw = 0;
  plVar2 = (long *)v->content;
  lVar3 = *plVar2;
  if (0 < lVar3) {
    lVar4 = 0;
    do {
      lVar1 = *(long *)(plVar2[2] + lVar4 * 8);
      if (*(long *)(*(long *)(lVar1 + 8) + 0x20) != 0) {
        N_VSpace(lVar1,&local_38,&local_40);
        *lrw = *lrw + local_38;
        *liw = *liw + local_40;
        plVar2 = (long *)v->content;
        lVar3 = *plVar2;
      }
      lVar4 = lVar4 + 1;
    } while (lVar4 < lVar3);
  }
  return;
}

Assistant:

void MVAPPEND(N_VSpace)(N_Vector v, sunindextype* lrw, sunindextype* liw)
{
  SUNFunctionBegin(v->sunctx);
  sunindextype i, lrw1, liw1;
  *lrw = 0;
  *liw = 0;
  for (i = 0; i < MANYVECTOR_NUM_SUBVECS(v); i++)
  {
    /* update space requirements for this subvector (if 'nvspace' is implemented) */
    if ((MANYVECTOR_SUBVEC(v, i))->ops->nvspace != NULL)
    {
      N_VSpace(MANYVECTOR_SUBVEC(v, i), &lrw1, &liw1);
      SUNCheckLastErrVoid();
      *lrw += lrw1;
      *liw += liw1;
    }
  }
  return;
}